

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O2

bool search(string *r,string *t,int flags)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  ostream *poVar4;
  runtime_error *this;
  regex re;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> m;
  string local_1b0 [32];
  ostringstream oss;
  
  booster::regex::regex(&re,(string *)r,flags);
  pcVar1 = (t->_M_dataplus)._M_p;
  cVar2 = booster::regex::search((char *)&re,pcVar1,(int)t->_M_string_length + (int)pcVar1);
  m.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  m.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (t->_M_dataplus)._M_p;
  cVar3 = booster::regex::search
                    ((char *)&re,pcVar1,(vector *)(pcVar1 + t->_M_string_length),(int)&m);
  if (cVar2 == cVar3) {
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&m.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    booster::regex::~regex(&re);
    return (bool)cVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
  std::operator<<(poVar4," v1==v2");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool search(std::string r,std::string t,int flags=0)
{
	booster::regex re(r,flags);
	bool v1 =  re.search(t.c_str(),t.c_str()+t.size());
	std::vector<std::pair<int,int> > m;
	bool v2 =  re.search(t.c_str(),t.c_str()+t.size(),m);
	TEST(v1==v2);
	return v1;
}